

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDEdge::ReplaceFaceInArray(ON_SubDEdge *this,ON_SubDFace *old_face,ON_SubDFace *new_face)

{
  ushort uVar1;
  ON_SubDFacePtr *pOVar2;
  uint uVar3;
  ON_SubDFacePtr *pOVar4;
  ON_SubDFacePtr *pOVar5;
  uint uVar6;
  uint uVar7;
  ON_SubDFacePtr *pOVar8;
  
  uVar3 = 0xffffffff;
  if (old_face != new_face && old_face != (ON_SubDFace *)0x0) {
    uVar3 = FaceArrayIndex(this,old_face);
  }
  uVar6 = 0xffffffff;
  if (uVar3 != 0xffffffff) {
    pOVar2 = this->m_facex;
    pOVar5 = pOVar2 + (uVar3 - 2);
    if (uVar3 < 2) {
      pOVar5 = this->m_face2 + uVar3;
    }
    uVar6 = uVar3;
    if (new_face == (ON_SubDFace *)0x0) {
      uVar1 = this->m_face_count;
      uVar7 = uVar1 - 1;
      this->m_face_count = (unsigned_short)uVar7;
      if (uVar3 + 1 < (uint)uVar1) {
        pOVar8 = pOVar2 + (uVar3 - 1);
        if (uVar3 == 0) {
          pOVar8 = this->m_face2 + 1;
        }
        do {
          pOVar4 = pOVar8;
          if (uVar3 == 1) {
            pOVar4 = pOVar2;
          }
          if (uVar3 == 2) {
            pOVar4 = pOVar8;
            pOVar5 = pOVar2;
          }
          pOVar5->m_ptr = pOVar4->m_ptr;
          pOVar5 = pOVar5 + 1;
          uVar3 = uVar3 + 1;
          pOVar8 = pOVar4 + 1;
          uVar6 = uVar3;
        } while (uVar7 != uVar3);
      }
    }
    else {
      pOVar5->m_ptr = (ulong)((uint)pOVar5->m_ptr & 1) | (ulong)new_face;
    }
  }
  return uVar6;
}

Assistant:

unsigned int ON_SubDEdge::ReplaceFaceInArray(const ON_SubDFace * old_face, const ON_SubDFace * new_face)
{
  unsigned efi = (nullptr != old_face && old_face != new_face) ? FaceArrayIndex(old_face) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == efi)
    return ON_UNSET_UINT_INDEX;
  ON_SubDFacePtr* fptr = (efi < 2) ? &m_face2[efi] : &m_facex[efi - 2];
  if (nullptr != new_face)
  {
    *fptr = ON_SubDFacePtr::Create(new_face, fptr->FaceDirection());
  }
  else
  {    
    unsigned efi1 = efi + 1;
    ON_SubDFacePtr* fptr1 = (efi1 < 2) ? &m_face2[efi1] : &m_facex[efi1 - 2];
    for (const unsigned c = (unsigned)(m_face_count--); efi1 < c; ++efi, ++efi1)
    {
      if (2 == efi)
        fptr = m_facex;
      else if (2 == efi1)
        fptr1 = m_facex;
      *fptr++ = *fptr1++;
    }
  }
  return efi;
}